

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O2

void __thiscall
Js::FunctionExecutionStateMachine::SetIsSpeculativeJitCandidate(FunctionExecutionStateMachine *this)

{
  ExecutionMode EVar1;
  uint16 uVar2;
  
  EVar1 = GetExecutionMode(this);
  if (EVar1 == AutoProfilingInterpreter) {
    uVar2 = GetProfiledIterations(this);
    if (uVar2 == 0) {
      FunctionBody::TraceExecutionMode((this->owner).ptr,"IsSpeculativeJitCandidate (before)");
      if (this->autoProfilingInterpreter0Limit == 0) {
        if (this->profilingInterpreter0Limit == 0) {
          this->profilingInterpreter0Limit = this->autoProfilingInterpreter1Limit;
          this->autoProfilingInterpreter1Limit = 0;
        }
      }
      else {
        (&this->profilingInterpreter0Limit)[this->profilingInterpreter0Limit != 0] =
             (&this->profilingInterpreter0Limit)[this->profilingInterpreter0Limit != 0] +
             this->autoProfilingInterpreter0Limit;
        this->autoProfilingInterpreter0Limit = 0;
      }
      FunctionBody::TraceExecutionMode((this->owner).ptr,"IsSpeculativeJitCandidate");
      TryTransitionToNextInterpreterExecutionMode(this);
      return;
    }
  }
  return;
}

Assistant:

void FunctionExecutionStateMachine::SetIsSpeculativeJitCandidate()
    {
        // This function is a candidate for speculative JIT. Ensure that it is profiled immediately by transitioning out of the
        // auto-profiling interpreter mode.
        if (GetExecutionMode() != ExecutionMode::AutoProfilingInterpreter || GetProfiledIterations() != 0)
        {
            return;
        }

        owner->TraceExecutionMode("IsSpeculativeJitCandidate (before)");

        if (autoProfilingInterpreter0Limit != 0)
        {
            (profilingInterpreter0Limit == 0 ? profilingInterpreter0Limit : autoProfilingInterpreter1Limit) +=
                autoProfilingInterpreter0Limit;
            autoProfilingInterpreter0Limit = 0;
        }
        else if (profilingInterpreter0Limit == 0)
        {
            profilingInterpreter0Limit += autoProfilingInterpreter1Limit;
            autoProfilingInterpreter1Limit = 0;
        }

        owner->TraceExecutionMode("IsSpeculativeJitCandidate");

        TryTransitionToNextInterpreterExecutionMode();
    }